

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MES.h
# Opt level: O1

int ConnectMES(MES *pMES,char *szCfgFilePath)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  char line [256];
  char local_138;
  char local_137;
  
  memset(pMES->szCfgFilePath,0,0x100);
  sprintf(pMES->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(&local_138,0,0x100);
    memset(pMES->szDevPath + 5,0,0xfb);
    builtin_strncpy(pMES->szDevPath,"COM1",5);
    pMES->BaudRate = 0x1c200;
    pMES->timeout = 500;
    pMES->threadperiod = 100;
    pMES->bSaveRawData = 1;
    __stream = fopen(szCfgFilePath,"r");
    if (__stream == (FILE *)0x0) {
      pcVar2 = "Configuration file not found.";
    }
    else {
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001c22ae;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001c22ae:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%255s",pMES->szDevPath);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001c232d;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001c232d:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pMES->BaudRate);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001c23ac;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001c23ac:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pMES->timeout);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001c242b;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001c242b:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pMES->threadperiod);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001c24ac;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001c24ac:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pMES->bSaveRawData);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      iVar1 = fclose(__stream);
      if (iVar1 == 0) goto LAB_001c2512;
      pcVar2 = "fclose() failed.";
    }
    puts(pcVar2);
  }
LAB_001c2512:
  if (pMES->threadperiod < 0) {
    puts("Invalid parameter : threadperiod.");
    pMES->threadperiod = 100;
  }
  pMES->LastDistance = 0.0;
  iVar1 = OpenRS232Port(&pMES->RS232Port,pMES->szDevPath);
  if (iVar1 == 0) {
    iVar1 = (pMES->RS232Port).DevType;
    if (3 < iVar1 - 1U) {
      if ((iVar1 != 0) ||
         (iVar1 = SetOptionsComputerRS232Port
                            ((pMES->RS232Port).hDev,pMES->BaudRate,'\0',0,'\b','\0',pMES->timeout),
         iVar1 != 0)) {
        puts("Unable to connect to a MES.");
        CloseRS232Port(&pMES->RS232Port);
        goto LAB_001c255b;
      }
      tcflush(*(int *)&(pMES->RS232Port).hDev,2);
    }
    puts("MES connected.");
    iVar1 = 0;
  }
  else {
    puts("Unable to connect to a MES.");
LAB_001c255b:
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

inline int ConnectMES(MES* pMES, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];

	memset(pMES->szCfgFilePath, 0, sizeof(pMES->szCfgFilePath));
	sprintf(pMES->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pMES->szDevPath, 0, sizeof(pMES->szDevPath));
		sprintf(pMES->szDevPath, "COM1");
		pMES->BaudRate = 115200;
		pMES->timeout = 500;
		pMES->threadperiod = 100;
		pMES->bSaveRawData = 1;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pMES->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMES->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMES->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMES->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMES->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pMES->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pMES->threadperiod = 100;
	}

	// Used to save raw data, should be handled specifically...
	//pMES->pfSaveFile = NULL;

	pMES->LastDistance = 0;

	if (OpenRS232Port(&pMES->RS232Port, pMES->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a MES.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pMES->RS232Port, pMES->BaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)pMES->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a MES.\n");
		CloseRS232Port(&pMES->RS232Port);
		return EXIT_FAILURE;
	}

	printf("MES connected.\n");

	return EXIT_SUCCESS;
}